

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O3

bool __thiscall ON_Line::InPlane(ON_Line *this,ON_Plane *plane,double tolerance)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  bool bVar4;
  ON_3dVector *pOVar5;
  bool bVar6;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar7;
  double dVar8;
  ON_3dVector X;
  ON_3dVector Y;
  ON_3dVector v;
  ON_3dVector local_98;
  ON_3dVector local_78;
  undefined1 local_58 [16];
  ON_3dVector local_40;
  
  local_58._8_4_ = in_XMM0_Dc;
  local_58._0_8_ = tolerance;
  local_58._12_4_ = in_XMM0_Dd;
  ON_3dPoint::operator-(&local_40,&this->to,&this->from);
  dVar7 = ABS(local_40.x);
  dVar8 = ABS(local_40.y);
  dVar3 = ABS(local_40.z);
  bVar4 = dVar7 <= (double)local_58._0_8_;
  bVar2 = dVar8 <= (double)local_58._0_8_;
  if (((double)local_58._0_8_ < dVar3) || (bVar2 && bVar4)) {
    if (((double)local_58._0_8_ < dVar7) ||
       (dVar8 <= (double)local_58._0_8_ && dVar3 <= (double)local_58._0_8_)) {
      if (((double)local_58._0_8_ < dVar8) ||
         (dVar3 <= (double)local_58._0_8_ && dVar7 <= (double)local_58._0_8_)) {
        bVar1 = dVar3 <= (double)local_58._0_8_;
        local_98.z = local_40.z;
        local_98.x = local_40.x;
        local_98.y = local_40.y;
        ON_3dVector::Unitize(&local_98);
        ON_3dVector::PerpendicularTo(&local_78,&local_98);
        bVar6 = true;
        if ((bVar2 && bVar4) && bVar1) {
          bVar4 = ON_3dVector::IsZero(&local_98);
          if (bVar4) {
            local_98.z = ON_3dVector::XAxis.z;
            local_98.x = ON_3dVector::XAxis.x;
            local_98.y = ON_3dVector::XAxis.y;
            local_78.x = ON_3dVector::YAxis.x;
            local_78.y = ON_3dVector::YAxis.y;
            local_78.z = ON_3dVector::YAxis.z;
          }
          bVar6 = false;
        }
        goto LAB_004c6f6e;
      }
      local_98.z = ON_3dVector::ZAxis.z;
      local_98.x = ON_3dVector::ZAxis.x;
      local_98.y = ON_3dVector::ZAxis.y;
      pOVar5 = &ON_3dVector::XAxis;
    }
    else {
      local_98.z = ON_3dVector::YAxis.z;
      local_98.x = ON_3dVector::YAxis.x;
      local_98.y = ON_3dVector::YAxis.y;
      pOVar5 = &ON_3dVector::ZAxis;
    }
  }
  else {
    local_98.z = ON_3dVector::XAxis.z;
    local_98.x = ON_3dVector::XAxis.x;
    local_98.y = ON_3dVector::XAxis.y;
    pOVar5 = &ON_3dVector::YAxis;
  }
  local_78.x = pOVar5->x;
  local_78.y = pOVar5->y;
  local_78.z = pOVar5->z;
  bVar6 = true;
LAB_004c6f6e:
  ON_Plane::CreateFromFrame(plane,&this->from,&local_98,&local_78);
  return bVar6;
}

Assistant:

bool ON_Line::InPlane( ON_Plane& plane, double tolerance ) const
{
  const ON_3dVector v = to-from;
  const bool bTinyX = fabs(v.x) <= tolerance;
  const bool bTinyY = fabs(v.y) <= tolerance;
  const bool bTinyZ = fabs(v.z) <= tolerance;
  bool rc = true;
  ON_3dVector X;
  ON_3dVector Y;
  if ( bTinyZ && ( !bTinyX || !bTinyY ) )
  {
    X = ON_3dVector::XAxis;
    Y = ON_3dVector::YAxis;
  }
  else if ( bTinyX && ( !bTinyY || !bTinyZ ) )
  {
    X = ON_3dVector::YAxis;
    Y = ON_3dVector::ZAxis;
  }
  else if ( bTinyY && ( !bTinyZ || !bTinyX ) )
  {
    X = ON_3dVector::ZAxis;
    Y = ON_3dVector::XAxis;
  }
  else
  {
    X = v;
    X.Unitize();
    Y.PerpendicularTo(X);
    if ( bTinyX && bTinyY && bTinyZ )
    {
      rc = false;
      if ( X.IsZero() )
      {
        X = ON_3dVector::XAxis;
        Y = ON_3dVector::YAxis;
      }
    }
  }
  plane.CreateFromFrame( from, X, Y );
  return rc;
}